

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseVersionNum(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  int iVar4;
  xmlChar xVar5;
  ulong uVar6;
  
  pxVar1 = (xmlChar *)(*xmlMallocAtomic)(10);
  if (pxVar1 == (xmlChar *)0x0) {
LAB_00162010:
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    xVar5 = *ctxt->input->cur;
    if ((byte)(xVar5 - 0x30) < 10) {
      *pxVar1 = xVar5;
      xmlNextChar(ctxt);
      if (*ctxt->input->cur == '.') {
        pxVar1[1] = '.';
        xmlNextChar(ctxt);
        xVar5 = *ctxt->input->cur;
        uVar2 = 2;
        if ((byte)(xVar5 - 0x30) < 10) {
          iVar4 = 10;
          uVar6 = 2;
          do {
            uVar2 = uVar6 + 1;
            pxVar3 = pxVar1;
            if ((long)iVar4 <= (long)uVar2) {
              iVar4 = iVar4 * 2;
              pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar1,(long)iVar4);
              if (pxVar3 == (xmlChar *)0x0) {
                (*xmlFree)(pxVar1);
                goto LAB_00162010;
              }
            }
            pxVar1 = pxVar3;
            pxVar1[uVar6] = xVar5;
            xmlNextChar(ctxt);
            xVar5 = *ctxt->input->cur;
            uVar6 = uVar2;
          } while ((byte)(xVar5 - 0x30) < 10);
          uVar2 = uVar2 & 0xffffffff;
        }
        pxVar1[uVar2] = '\0';
        return pxVar1;
      }
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseVersionNum(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    xmlChar cur;

    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    cur = CUR;
    if (!((cur >= '0') && (cur <= '9'))) {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    if (cur != '.') {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    while ((cur >= '0') && (cur <= '9')) {
	if (len + 1 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	NEXT;
	cur=CUR;
    }
    buf[len] = 0;
    return(buf);
}